

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O1

uint __thiscall Histogram<unsigned_int>::bin(Histogram<unsigned_int> *this,uint value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  
  uVar2 = (**this->_vptr_Histogram)(this,CONCAT44(in_register_00000034,value));
  uVar1 = this->_lowerBound;
  uVar3 = 0;
  if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
    if (uVar2 < this->_upperBound) {
      uVar3 = ((uVar2 - uVar1) * this->_bins) / (this->_upperBound - uVar1);
      if (this->_bins <= uVar3) {
        __assert_fail("bin < _bins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/histogram.h"
                      ,0x3e,"unsigned int Histogram<unsigned int>::bin(T) const [T = unsigned int]")
        ;
      }
    }
    else {
      uVar3 = this->_bins;
    }
  }
  return uVar3;
}

Assistant:

unsigned int bin(T value) const {
        value = v(value);
        if (value <= _lowerBound)
            return 0;
        if (value >= _upperBound)
            return _bins;

        unsigned int bin = (value - _lowerBound)*_bins/(_upperBound - _lowerBound);
        assert(bin < _bins);
        return bin;
    }